

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O3

pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
* lest::split_option(pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *__return_storage_ptr__,text *arg)

{
  pointer pcVar1;
  long lVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  undefined1 *local_160;
  long local_158;
  undefined1 local_150 [16];
  undefined1 *local_140;
  long local_138;
  undefined1 local_130 [16];
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_120;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_e0;
  long local_d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d0;
  undefined1 *local_c0;
  long local_b8;
  undefined1 local_b0 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  lVar2 = std::__cxx11::string::rfind((char)arg,0x3d);
  if (lVar2 == -1) {
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    pcVar1 = (arg->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_40,pcVar1,pcVar1 + arg->_M_string_length);
    local_e0 = &local_d0;
    local_d8 = 0;
    local_d0._M_local_buf[0] = '\0';
    local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
    std::__cxx11::string::_M_construct<char*>((string *)&local_60,local_e0);
    std::make_pair<std::__cxx11::string,std::__cxx11::string>(&local_120,&local_40,&local_60);
    local_160 = local_150;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_160,local_120.first._M_dataplus._M_p,
               local_120.first._M_dataplus._M_p + local_120.first._M_string_length);
    local_140 = local_130;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_140,local_120.second._M_dataplus._M_p,
               local_120.second._M_dataplus._M_p + local_120.second._M_string_length);
  }
  else {
    std::__cxx11::string::substr((ulong)&local_e0,(ulong)arg);
    local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_80,local_e0,local_e0->_M_local_buf + local_d8);
    std::__cxx11::string::substr((ulong)&local_c0,(ulong)arg);
    local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
    std::__cxx11::string::_M_construct<char*>((string *)&local_a0,local_c0,local_c0 + local_b8);
    std::make_pair<std::__cxx11::string,std::__cxx11::string>(&local_120,&local_80,&local_a0);
    local_160 = local_150;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_160,local_120.first._M_dataplus._M_p,
               local_120.first._M_dataplus._M_p + local_120.first._M_string_length);
    local_140 = local_130;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_140,local_120.second._M_dataplus._M_p,
               local_120.second._M_dataplus._M_p + local_120.second._M_string_length);
  }
  (__return_storage_ptr__->first)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->first).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,local_160,local_160 + local_158);
  (__return_storage_ptr__->second)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->second).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&__return_storage_ptr__->second,local_140,local_140 + local_138);
  if (local_140 != local_130) {
    operator_delete(local_140);
  }
  if (local_160 != local_150) {
    operator_delete(local_160);
  }
  paVar3 = &local_120.second.field_2;
  if (lVar2 == -1) {
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_120.second._M_dataplus._M_p != paVar3) {
      operator_delete(local_120.second._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_120.first._M_dataplus._M_p != &local_120.first.field_2) {
      operator_delete(local_120.first._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != &local_60.field_2) {
      operator_delete(local_60._M_dataplus._M_p);
    }
    if (local_e0 != &local_d0) {
      operator_delete(local_e0);
    }
    paVar3 = &local_40.field_2;
  }
  else {
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_120.second._M_dataplus._M_p != paVar3) {
      operator_delete(local_120.second._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_120.first._M_dataplus._M_p != &local_120.first.field_2) {
      operator_delete(local_120.first._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
      operator_delete(local_a0._M_dataplus._M_p);
    }
    if (local_c0 != local_b0) {
      operator_delete(local_c0);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != &local_80.field_2) {
      operator_delete(local_80._M_dataplus._M_p);
    }
    paVar3 = &local_d0;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*(undefined1 **)(paVar3->_M_local_buf + -0x10) != paVar3) {
    operator_delete(*(undefined1 **)(paVar3->_M_local_buf + -0x10));
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::pair<text, text>
split_option( text arg )
{
    text::size_type pos = arg.rfind( '=' );

    return pos == text::npos
                ? std::make_pair( arg, text() )
                : std::make_pair( arg.substr( 0, pos ), arg.substr( pos + 1 ) );
}